

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# List.h
# Opt level: O2

void __thiscall
psy::C::
List<psy::C::ExtKR_ParameterDeclarationSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::ExtKR_ParameterDeclarationSyntax_*>_>
::~List(List<psy::C::ExtKR_ParameterDeclarationSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::ExtKR_ParameterDeclarationSyntax_*>_>
        *this)

{
  Managed::~Managed(&this->super_Managed);
  Managed::operator_delete(this);
  return;
}

Assistant:

class PSY_C_INTERNAL_API List : public Managed
{
public:
    List()
        : value(ValueT())
        , next(nullptr)
    {}

    List(const ValueT& value)
        : value(value)
        , next(nullptr)
    {}

    DerivedListT** skipToLast()
    {
        DerivedListT** cur = &next;
        while (*cur)
            cur = &(*cur)->next;
        return &(*cur);
    }

    ValueT lastValue() const
    {
        ValueT v = nullptr;
        for (auto it = const_cast<DerivedListT*>(static_cast<const DerivedListT*>(this));
                it;
                it = it->next) {
            if (it->value)
                v = it->value;
        }
        return v;
    }

    ValueT value;
    DerivedListT* next;

private:
    // Unavailable
    List(const List&) = delete;
    List& operator=(const List&) = delete;
}